

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *constNode)

{
  bool dummy2;
  uint dummy1;
  bool local_85;
  uint local_84;
  Reader local_80;
  Reader local_50;
  
  capnp::schema::Node::Const::Reader::getType(&local_50,constNode);
  capnp::schema::Node::Const::Reader::getValue(&local_80,constNode);
  validate(this,&local_50,&local_80,&local_84,&local_85);
  return;
}

Assistant:

void validate(const schema::Node::Const::Reader& constNode) {
    uint dummy1;
    bool dummy2;
    validate(constNode.getType(), constNode.getValue(), &dummy1, &dummy2);
  }